

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::anon_unknown_5::format_error_code(buffer *out,int error_code,string_view message)

{
  type_conflict1 tVar1;
  int iVar2;
  type tVar3;
  size_t sVar4;
  void *in_RCX;
  size_t __n;
  int in_EDX;
  void *__buf;
  uint32_t in_ESI;
  writer w;
  main_type abs_value;
  size_t error_code_size;
  char *in_stack_ffffffffffffff78;
  basic_buffer<char> *in_stack_ffffffffffffff80;
  locale_ref in_stack_ffffffffffffff88;
  back_insert_iterator<fmt::v5::internal::basic_buffer<char>_> in_stack_ffffffffffffff90;
  locale_ref local_50 [2];
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_40;
  uint32_t local_2c;
  long local_28;
  uint32_t local_1c;
  basic_string_view<char> local_10;
  
  local_1c = in_ESI;
  local_10.size_ = (size_t)in_RCX;
  local_10.data_._0_4_ = in_EDX;
  internal::basic_buffer<char>::resize(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
  local_28 = 8;
  local_2c = local_1c;
  tVar1 = internal::is_negative<int>(local_1c);
  if (tVar1) {
    local_2c = -local_2c;
    local_28 = local_28 + 1;
  }
  iVar2 = internal::count_digits(local_2c);
  tVar3 = internal::to_unsigned<int>(iVar2);
  local_28 = local_28 + (ulong)tVar3;
  back_insert_range<fmt::v5::internal::basic_buffer<char>_>::back_insert_range
            ((back_insert_range<fmt::v5::internal::basic_buffer<char>_> *)
             in_stack_ffffffffffffff90.container,
             (basic_buffer<char> *)in_stack_ffffffffffffff88.locale_);
  internal::locale_ref::locale_ref(local_50);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::basic_writer
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
             in_stack_ffffffffffffff80,
             (back_insert_range<fmt::v5::internal::basic_buffer<char>_>)
             in_stack_ffffffffffffff90.container,in_stack_ffffffffffffff88);
  iVar2 = (int)in_stack_ffffffffffffff88.locale_;
  sVar4 = basic_string_view<char>::size(&local_10);
  __n = 500 - local_28;
  if (sVar4 <= __n) {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
              (&local_40,(int)local_10.data_,(void *)local_10.size_,__n);
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
              (&local_40,iVar2,in_stack_ffffffffffffff90.container,__n);
  }
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            (&local_40,(int)in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,__n);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            (&local_40,local_1c,__buf,__n);
  return;
}

Assistant:

void format_error_code(internal::buffer &out, int error_code,
                       string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  std::size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  typedef internal::int_traits<int>::main_type main_type;
  main_type abs_value = static_cast<main_type>(error_code);
  if (internal::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += internal::to_unsigned(internal::count_digits(abs_value));
  writer w(out);
  if (message.size() <= inline_buffer_size - error_code_size) {
    w.write(message);
    w.write(SEP);
  }
  w.write(ERROR_STR);
  w.write(error_code);
  assert(out.size() <= inline_buffer_size);
}